

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O3

set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> * __thiscall
SimpleStrategy::matchCalls
          (set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
           *__return_storage_ptr__,SimpleStrategy *this,
          set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *a,
          set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *b)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  _Rb_tree_header *p_Var2;
  ulong uVar3;
  ulong uVar4;
  _Rb_tree_header *p_Var5;
  iterator __position;
  iterator __position_00;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Self __tmp;
  _Self __tmp_1;
  const_iterator __position_01;
  _Base_ptr p_Var8;
  const_iterator __position_02;
  bool bVar9;
  Call newCall;
  Call callB;
  Call callA;
  undefined1 local_f0 [16];
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_e0;
  undefined1 local_b0 [16];
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_a0;
  undefined1 local_70 [24];
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __position._M_node = (a->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(a->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
               *)(local_70 + 0x10);
    p_Var5 = &(b->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = &local_a0._M_impl.super__Rb_tree_header;
    do {
      local_70._0_8_ = &PTR__Call_00117b88;
      local_70._8_8_ = __position._M_node[1]._M_parent;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)this_00,
                 (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&__position._M_node[1]._M_left);
      p_Var6 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      __position_01._M_node = &p_Var5->_M_header;
      if (p_Var6 == (_Base_ptr)0x0) {
LAB_0010b99a:
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
        do {
          bVar9 = p_Var6[1]._M_parent < (ulong)local_70._8_8_;
          if (!bVar9) {
            __position_01._M_node = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar9];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position_01._M_node == p_Var5) ||
           ((ulong)local_70._8_8_ < __position_01._M_node[1]._M_parent)) goto LAB_0010b99a;
        local_b0._0_8_ = &PTR__Call_00117b88;
        local_b0._8_8_ = __position_01._M_node[1]._M_parent;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_Rb_tree(&local_a0,
                   (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&__position_01._M_node[1]._M_left);
        __position = std::
                     _Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                     ::erase_abi_cxx11_((_Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                                         *)a,__position._M_node);
        std::
        _Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
        ::erase_abi_cxx11_((_Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                            *)b,__position_01);
        local_f0._0_8_ = &PTR__Call_00117b88;
        local_f0._8_8_ = local_70._8_8_;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_e0._M_impl.super__Rb_tree_header._M_header;
        local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
        __position_00._M_node = local_58._M_left;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (local_58._M_left != &local_58) {
          do {
            if (local_a0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0010baa0:
              __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
            }
            else {
              uVar3 = *(ulong *)(__position_00._M_node + 1);
              __position_02._M_node = &p_Var2->_M_header;
              p_Var6 = local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var7 = p_Var6;
                p_Var8 = __position_02._M_node;
                uVar4 = *(ulong *)(p_Var7 + 1);
                __position_02._M_node = p_Var7;
                if (uVar4 < uVar3) {
                  __position_02._M_node = p_Var8;
                }
                p_Var6 = (&p_Var7->_M_left)[uVar4 < uVar3];
              } while ((&p_Var7->_M_left)[uVar4 < uVar3] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)__position_02._M_node == p_Var2) goto LAB_0010baa0;
              if (uVar4 < uVar3) {
                p_Var7 = p_Var8;
              }
              if (uVar3 < *(ulong *)(p_Var7 + 1)) goto LAB_0010baa0;
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                  *)&local_a0,__position_02);
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&local_e0,(unsigned_long *)(__position_00._M_node + 1));
              __position_00 =
                   std::
                   _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   ::erase_abi_cxx11_(this_00,__position_00._M_node);
            }
          } while (__position_00._M_node != &local_58);
          if (local_e0._M_impl.super__Rb_tree_header._M_node_count != 0) {
            std::
            _Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
            ::_M_insert_unique<CfgData::Call_const&>
                      ((_Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                        *)__return_storage_ptr__,(Call *)local_f0);
          }
        }
        if (local_38 != 0) {
          std::
          _Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
          ::_M_insert_unique<CfgData::Call_const&>
                    ((_Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                      *)a,(Call *)local_70);
        }
        if (local_a0._M_impl.super__Rb_tree_header._M_node_count != 0) {
          std::
          _Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
          ::_M_insert_unique<CfgData::Call_const&>
                    ((_Rb_tree<CfgData::Call,CfgData::Call,std::_Identity<CfgData::Call>,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                      *)b,(Call *)local_b0);
        }
        local_f0._0_8_ = &PTR__Call_00117b88;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&local_e0);
        local_b0._0_8_ = &PTR__Call_00117b88;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&local_a0);
      }
      local_70._0_8_ = &PTR__Call_00117b88;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)this_00);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CfgData::Call> SimpleStrategy::matchCalls(std::set<CfgData::Call>& a, std::set<CfgData::Call>& b) {
	std::set<CfgData::Call> match;

	std::set<CfgData::Call>::iterator itA = a.begin();
	while (itA != a.end()) {
		CfgData::Call callA = *itA;

		std::set<CfgData::Call>::iterator itB = b.find(callA);
		if (itB != b.end()) {
			CfgData::Call callB = *itB;

			// Always remove, it may be added again later.
			itA = a.erase(itA);
			itB = b.erase(itB);

			CfgData::Call newCall(callA.block_addr);

			std::set<Addr>::iterator it2A = callA.calls.begin();
			while (it2A != callA.calls.end()) {
				std::set<Addr>::iterator it2B = callB.calls.find(*it2A);
				if (it2B != callB.calls.end()) {
					callB.calls.erase(it2B);

					newCall.calls.insert(*it2A);
					it2A = callA.calls.erase(it2A);
				} else {
					it2A++;
				}
			}

			if (newCall.calls.size() > 0)
				match.insert(newCall);

			// If it still has at least one call, add it back.
			if (!callA.calls.empty())
				a.insert(callA);
			if (!callB.calls.empty())
				b.insert(callB);
		} else {
			itA++;
		}
	}

	return match;
}